

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

void __thiscall
ser::OffsetTable::AddFieldRecord
          (OffsetTable *this,Savepoint *savepoint,string *fieldName,offset_t offset,
          checksum_t *checksum)

{
  iterator iVar1;
  ostream *poVar2;
  SerializationException *this_00;
  SerializationException exception;
  string local_1c0 [32];
  ostringstream msg;
  
  iVar1 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    AddFieldRecord(this,*(int *)&iVar1._M_node[3]._M_left,fieldName,offset,checksum);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar2 = std::operator<<((ostream *)&msg,"Error: savepoint ");
  Savepoint::ToString_abi_cxx11_((string *)&exception,savepoint);
  poVar2 = std::operator<<(poVar2,(string *)&exception);
  poVar2 = std::operator<<(poVar2," is not registered in table\n");
  poVar2 = std::operator<<(poVar2,"Saving the field ");
  poVar2 = std::operator<<(poVar2,(string *)fieldName);
  poVar2 = std::operator<<(poVar2," at offset ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2," is not possible\n");
  std::__cxx11::string::~string((string *)&exception);
  exception._0_8_ = &PTR__SerializationException_0018fa68;
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  std::__cxx11::string::~string(local_1c0);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,&exception);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void OffsetTable::AddFieldRecord(const Savepoint& savepoint, const std::string& fieldName,
                                 offset_t offset, const checksum_t& checksum)
{
    // Find savepoint ID
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    if (iter == savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is not registered in table\n"
            << "Saving the field " << fieldName << " at offset " << offset << " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    AddFieldRecord(iter->second, fieldName, offset, checksum);
}